

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doJSONOutlines(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  mapped_type *pmVar1;
  int iVar2;
  pointer pQVar3;
  JSON j_outlines;
  QPDFOutlineDocumentHelper odh;
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  page_numbers;
  JSON local_e8;
  QPDFOutlineDocumentHelper local_d8;
  undefined1 local_b8 [32];
  Pipeline *local_98;
  bool *local_90;
  QPDFJob *local_88;
  QPDF *local_80;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_78;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_d8,pdf);
  local_98 = p;
  local_90 = first;
  local_80 = pdf;
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_b8,
             (QPDFPageDocumentHelper *)&local_d8);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_d8);
  if (local_b8._0_8_ != local_b8._8_8_) {
    iVar2 = 1;
    pQVar3 = (pointer)local_b8._0_8_;
    do {
      local_d8.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper =
           (_func_int **)
           (pQVar3->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d8.super_QPDFDocumentHelper.qpdf =
           (QPDF *)(pQVar3->super_QPDFObjectHelper).super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.super_QPDFDocumentHelper.qpdf !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.super_QPDFDocumentHelper.qpdf)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_d8.super_QPDFDocumentHelper.qpdf)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.super_QPDFDocumentHelper.qpdf)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_d8.super_QPDFDocumentHelper.qpdf)->_M_use_count + 1;
        }
      }
      local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_d8);
      pmVar1 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[]((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                             *)&local_60,(key_type *)&local_e8);
      *pmVar1 = iVar2;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.super_QPDFDocumentHelper.qpdf !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_d8.super_QPDFDocumentHelper.qpdf);
      }
      pQVar3 = pQVar3 + 1;
      iVar2 = iVar2 + 1;
    } while (pQVar3 != (pointer)local_b8._8_8_);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_b8);
  JSON::makeArray();
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&local_d8,local_80);
  QPDFOutlineDocumentHelper::getTopLevelOutlines(&local_78,&local_d8);
  addOutlinesToJson(local_88,&local_78,&local_e8,
                    (map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                     *)&local_60);
  std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector(&local_78)
  ;
  local_b8._0_8_ = (pointer)(local_b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"outlines","");
  JSON::writeDictionaryItem(local_98,local_90,(string *)local_b8,&local_e8,1);
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&local_d8);
  if (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
QPDFJob::doJSONOutlines(Pipeline* p, bool& first, QPDF& pdf)
{
    std::map<QPDFObjGen, int> page_numbers;
    int n = 0;
    for (auto const& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        QPDFObjectHandle oh = ph.getObjectHandle();
        page_numbers[oh.getObjGen()] = ++n;
    }

    JSON j_outlines = JSON::makeArray();
    QPDFOutlineDocumentHelper odh(pdf);
    addOutlinesToJson(odh.getTopLevelOutlines(), j_outlines, page_numbers);
    JSON::writeDictionaryItem(p, first, "outlines", j_outlines, 1);
}